

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::AnnotatedHandler::decode
          (AnnotatedHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader value;
  Reader value_00;
  Fault FVar1;
  bool bVar2;
  Vector<capnp::json::Value::Field::Reader> *pVVar3;
  size_t sVar4;
  size_t sVar5;
  Iterator IVar6;
  ArrayPtr<const_char> AVar7;
  Reader local_288;
  ArrayPtr<const_char> local_258;
  ArrayPtr<const_char> local_248;
  undefined1 auStack_238 [8];
  Reader field_1;
  Reader *__end3;
  Reader *__begin3;
  Vector<capnp::json::Value::Field::Reader> *__range3;
  Fault f_1;
  Vector<capnp::json::Value::Field::Reader> retriesCopy;
  Reader local_198;
  ArrayPtr<const_char> local_168;
  ArrayPtr<const_char> local_158;
  undefined1 local_140 [8];
  Reader field;
  undefined1 local_100 [8];
  Iterator __end2;
  undefined1 local_e0 [8];
  Iterator __begin2;
  Reader *__range2;
  Vector<capnp::json::Value::Field::Reader> retries;
  HashSet<const_void_*> unionsSeen;
  Fault local_20;
  Fault f;
  JsonCodec *codec_local;
  AnnotatedHandler *this_local;
  
  f.exception = (Exception *)codec;
  bVar2 = json::Value::Reader::isObject(&input);
  if (!bVar2) {
    kj::_::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x463,FAILED,"input.isObject()","");
    kj::_::Debug::Fault::fatal(&local_20);
  }
  kj::HashSet<const_void_*>::HashSet((HashSet<const_void_*> *)&retries.builder.disposer);
  kj::Vector<capnp::json::Value::Field::Reader>::Vector
            ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
  json::Value::Reader::getObject((Reader *)&__begin2.index,&input);
  IVar6 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::begin((Reader *)&__begin2.index);
  __end2._8_8_ = IVar6.container;
  __begin2.container._0_4_ = IVar6.index;
  local_e0 = (undefined1  [8])__end2._8_8_;
  IVar6 = List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader::end((Reader *)&__begin2.index);
  field._reader._40_8_ = IVar6.container;
  __end2.container._0_4_ = IVar6.index;
  local_100 = (undefined1  [8])field._reader._40_8_;
  while( true ) {
    bVar2 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
            ::operator!=((IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                          *)local_e0,
                         (IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                          *)local_100);
    if (!bVar2) break;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
    ::operator*((Reader *)local_140,
                (IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                 *)local_e0);
    FVar1 = f;
    AVar7 = (ArrayPtr<const_char>)json::Value::Field::Reader::getName((Reader *)local_140);
    local_168 = AVar7;
    local_158 = AVar7;
    json::Value::Field::Reader::getValue(&local_198,(Reader *)local_140);
    value._reader.capTable = local_198._reader.capTable;
    value._reader.segment = local_198._reader.segment;
    value._reader.data = local_198._reader.data;
    value._reader.pointers = local_198._reader.pointers;
    value._reader.dataSize = local_198._reader.dataSize;
    value._reader.pointerCount = local_198._reader.pointerCount;
    value._reader._38_2_ = local_198._reader._38_2_;
    value._reader.nestingLimit = local_198._reader.nestingLimit;
    value._reader._44_4_ = local_198._reader._44_4_;
    bVar2 = decodeField(this,(JsonCodec *)FVar1.exception,(StringPtr)local_158,value,output,
                        (HashSet<const_void_*> *)&retries.builder.disposer);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      kj::Vector<capnp::json::Value::Field::Reader>::add<capnp::json::Value::Field::Reader&>
                ((Vector<capnp::json::Value::Field::Reader> *)&__range2,(Reader *)local_140);
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
                  *)local_e0);
  }
  do {
    bVar2 = kj::Vector<capnp::json::Value::Field::Reader>::empty
                      ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pVVar3 = kj::mv<kj::Vector<capnp::json::Value::Field::Reader>>
                       ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
    kj::Vector<capnp::json::Value::Field::Reader>::Vector
              ((Vector<capnp::json::Value::Field::Reader> *)&f_1,pVVar3);
    bVar2 = kj::Vector<capnp::json::Value::Field::Reader>::empty
                      ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
    if (!bVar2) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&__range3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x46d,FAILED,"retries.empty()","");
      kj::_::Debug::Fault::fatal((Fault *)&__range3);
    }
    __end3 = kj::Vector<capnp::json::Value::Field::Reader>::begin
                       ((Vector<capnp::json::Value::Field::Reader> *)&f_1);
    field_1._reader._40_8_ =
         kj::Vector<capnp::json::Value::Field::Reader>::end
                   ((Vector<capnp::json::Value::Field::Reader> *)&f_1);
    for (; FVar1.exception = f.exception, __end3 != (Reader *)field_1._reader._40_8_;
        __end3 = __end3 + 1) {
      auStack_238 = (undefined1  [8])(__end3->_reader).segment;
      field_1._reader.segment = (SegmentReader *)(__end3->_reader).capTable;
      field_1._reader.capTable = (CapTableReader *)(__end3->_reader).data;
      field_1._reader.data = (__end3->_reader).pointers;
      field_1._reader.pointers = *(WirePointer **)&(__end3->_reader).dataSize;
      field_1._reader.dataSize = (__end3->_reader).nestingLimit;
      field_1._reader.pointerCount = *(StructPointerCount *)&(__end3->_reader).field_0x2c;
      field_1._reader._38_2_ = *(undefined2 *)&(__end3->_reader).field_0x2e;
      AVar7 = (ArrayPtr<const_char>)json::Value::Field::Reader::getName((Reader *)auStack_238);
      local_258 = AVar7;
      local_248 = AVar7;
      json::Value::Field::Reader::getValue(&local_288,(Reader *)auStack_238);
      value_00._reader.capTable = local_288._reader.capTable;
      value_00._reader.segment = local_288._reader.segment;
      value_00._reader.data = local_288._reader.data;
      value_00._reader.pointers = local_288._reader.pointers;
      value_00._reader.dataSize = local_288._reader.dataSize;
      value_00._reader.pointerCount = local_288._reader.pointerCount;
      value_00._reader._38_2_ = local_288._reader._38_2_;
      value_00._reader.nestingLimit = local_288._reader.nestingLimit;
      value_00._reader._44_4_ = local_288._reader._44_4_;
      bVar2 = decodeField(this,(JsonCodec *)FVar1.exception,(StringPtr)local_248,value_00,output,
                          (HashSet<const_void_*> *)&retries.builder.disposer);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        kj::Vector<capnp::json::Value::Field::Reader>::add<capnp::json::Value::Field::Reader&>
                  ((Vector<capnp::json::Value::Field::Reader> *)&__range2,(Reader *)auStack_238);
      }
    }
    sVar4 = kj::Vector<capnp::json::Value::Field::Reader>::size
                      ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
    sVar5 = kj::Vector<capnp::json::Value::Field::Reader>::size
                      ((Vector<capnp::json::Value::Field::Reader> *)&f_1);
    kj::Vector<capnp::json::Value::Field::Reader>::~Vector
              ((Vector<capnp::json::Value::Field::Reader> *)&f_1);
  } while (sVar4 != sVar5);
  kj::Vector<capnp::json::Value::Field::Reader>::~Vector
            ((Vector<capnp::json::Value::Field::Reader> *)&__range2);
  kj::HashSet<const_void_*>::~HashSet((HashSet<const_void_*> *)&retries.builder.disposer);
  return;
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    KJ_REQUIRE(input.isObject());
    kj::HashSet<const void*> unionsSeen;
    kj::Vector<JsonValue::Field::Reader> retries;
    for (auto field: input.getObject()) {
      if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
        retries.add(field);
      }
    }
    while (!retries.empty()) {
      auto retriesCopy = kj::mv(retries);
      KJ_ASSERT(retries.empty());
      for (auto field: retriesCopy) {
        if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
          retries.add(field);
        }
      }
      if (retries.size() == retriesCopy.size()) {
        // We made no progress in this iteration. Give up on the remaining fields.
        break;
      }
    }
  }